

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line-parser.cpp
# Opt level: O2

void license::printBasicHelp(char *prog_name)

{
  ostream *poVar1;
  string local_50 [32];
  path local_30;
  
  printHelpHeader(prog_name);
  boost::filesystem::path::path(&local_30,prog_name);
  boost::filesystem::path::filename();
  poVar1 = std::operator<<((ostream *)&std::cout,local_50);
  poVar1 = std::operator<<(poVar1," [command] [options]");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           " available commands: \"project initialize\", \"project list\", \"license issue\", \"license list\""
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout," to see specific command options type: ");
  poVar1 = std::operator<<(poVar1,prog_name);
  poVar1 = std::operator<<(poVar1," [command] --help");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

static void printBasicHelp(const char *prog_name) {
	printHelpHeader(prog_name);
	cout << fs::path(prog_name).filename().string() << " [command] [options]" << endl;
	cout << " available commands: \"project initialize\", \"project list\", \"license issue\", \"license list\""
		 << endl;
	cout << " to see specific command options type: " << prog_name << " [command] --help" << endl << endl;
}